

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btVector3.h
# Opt level: O2

btVector3 operator/(btVector3 *v1,btVector3 *v2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  btVector3 bVar3;
  
  bVar3.m_floats[0] = v1->m_floats[0] / v2->m_floats[0];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(v1->m_floats + 1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(v2->m_floats + 1);
  auVar2 = divps(auVar1,auVar2);
  bVar3.m_floats[1] = (btScalar)auVar2._0_4_;
  bVar3.m_floats[2] = (btScalar)auVar2._4_4_;
  bVar3.m_floats[3] = 0.0;
  return (btVector3)bVar3.m_floats;
}

Assistant:

SIMD_FORCE_INLINE btVector3
operator/(const btVector3& v1, const btVector3& v2)
{
#if defined BT_USE_SIMD_VECTOR3 && (defined(BT_USE_SSE_IN_API)&& defined (BT_USE_SSE))
	__m128 vec = _mm_div_ps(v1.mVec128, v2.mVec128);
	vec = _mm_and_ps(vec, btvFFF0fMask);
	return btVector3(vec);
#elif defined(BT_USE_NEON)
	float32x4_t x, y, v, m;

	x = v1.mVec128;
	y = v2.mVec128;

	v = vrecpeq_f32(y);			// v ~ 1/y
	m = vrecpsq_f32(y, v);		// m = (2-v*y)
	v = vmulq_f32(v, m);		// vv = v*m ~~ 1/y
	m = vrecpsq_f32(y, v);		// mm = (2-vv*y)
	v = vmulq_f32(v, x);		// x*vv
	v = vmulq_f32(v, m);		// (x*vv)*(2-vv*y) = x*(vv(2-vv*y)) ~~~ x/y

	return btVector3(v);
#else
	return btVector3(
			v1.m_floats[0] / v2.m_floats[0],
			v1.m_floats[1] / v2.m_floats[1],
			v1.m_floats[2] / v2.m_floats[2]);
#endif
}